

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImVector<ImGuiViewportP_*> *this;
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiViewportFlags IVar6;
  ImGuiViewportP *pIVar7;
  ImGuiWindow *window;
  ImDrawData *pIVar8;
  ushort uVar9;
  ImGuiContext *ctx;
  ImGuiWindow *pIVar10;
  uint uVar11;
  ImGuiViewportP **ppIVar12;
  ImDrawList *pIVar13;
  ImGuiWindow **ppIVar14;
  ImGuiIO *pIVar15;
  ulong uVar16;
  ImDrawList **ppIVar17;
  int n;
  int iVar18;
  ImGuiWindow *pIVar19;
  int n_2;
  long lVar20;
  int iVar21;
  int iVar22;
  ImVec2 IVar23;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  ImRect IVar28;
  ImVec2 local_90;
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImVec2 mouse_cursor_uv [4];
  undefined1 auVar24 [16];
  
  ctx = GImGui;
  if (GImGui->Initialized != false) {
    iVar18 = GImGui->FrameCountEnded;
    if (iVar18 != GImGui->FrameCount) {
      EndFrame();
      iVar18 = ctx->FrameCount;
    }
    ctx->FrameCountRendered = iVar18;
    (ctx->IO).MetricsRenderWindows = 0;
    CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
    this = &ctx->Viewports;
    for (iVar18 = 0; iVar18 != this->Size; iVar18 = iVar18 + 1) {
      ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](this,iVar18);
      pIVar7 = *ppIVar12;
      ImDrawDataBuilder::Clear(&pIVar7->DrawDataBuilder);
      if (pIVar7->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar13 = GetBackgroundDrawList(&pIVar7->super_ImGuiViewport);
        AddDrawListToDrawData((pIVar7->DrawDataBuilder).Layers,pIVar13);
      }
    }
    pIVar19 = ctx->NavWindowingTarget;
    if (pIVar19 == (ImGuiWindow *)0x0) {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
      pIVar19 = (ImGuiWindow *)0x0;
    }
    else {
      if ((pIVar19->Flags & 0x2000) == 0) {
        windows_to_render_top_most[0] = pIVar19->RootWindow;
      }
      else {
        windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
      }
      pIVar19 = ctx->NavWindowingListWindow;
    }
    pIVar10 = windows_to_render_top_most[0];
    windows_to_render_top_most[1] = pIVar19;
    for (iVar18 = 0; iVar18 != (ctx->Windows).Size; iVar18 = iVar18 + 1) {
      ppIVar14 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar18);
      window = *ppIVar14;
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar19 && window != pIVar10) && (window->Flags & 0x1000000) == 0)) {
        AddRootWindowToDrawData(window);
      }
    }
    for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
      pIVar19 = windows_to_render_top_most[lVar20];
      if (((pIVar19 != (ImGuiWindow *)0x0) && (pIVar19->Active == true)) &&
         (pIVar19->Hidden == false)) {
        AddRootWindowToDrawData(pIVar19);
      }
    }
    local_70.x = 0.0;
    local_70.y = 0.0;
    local_90.x = 0.0;
    local_90.y = 0.0;
    mouse_cursor_uv[2].x = 0.0;
    mouse_cursor_uv[2].y = 0.0;
    mouse_cursor_uv[3].x = 0.0;
    mouse_cursor_uv[3].y = 0.0;
    mouse_cursor_uv[0].x = 0.0;
    mouse_cursor_uv[0].y = 0.0;
    mouse_cursor_uv[1].x = 0.0;
    mouse_cursor_uv[1].y = 0.0;
    if (((ctx->IO).MouseDrawCursor != false) && (ctx->MouseCursor != -1)) {
      ImFontAtlas::GetMouseCursorTexData
                ((ctx->IO).Fonts,ctx->MouseCursor,&local_70,&local_90,mouse_cursor_uv,
                 mouse_cursor_uv + 2);
    }
    (ctx->IO).MetricsRenderVertices = 0;
    (ctx->IO).MetricsRenderIndices = 0;
    for (iVar18 = 0; iVar18 < this->Size; iVar18 = iVar18 + 1) {
      ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](this,iVar18);
      pIVar7 = *ppIVar12;
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar7->DrawDataBuilder);
      if ((0.0 < local_90.x) && (0.0 < local_90.y)) {
        local_68 = ZEXT416((uint)((ctx->Style).MouseCursorScale *
                                 (pIVar7->super_ImGuiViewport).DpiScale));
        IVar28 = ImGuiViewportP::GetMainRect(pIVar7);
        IVar23 = (ctx->IO).MousePos;
        fVar26 = IVar23.x;
        fVar27 = IVar23.y;
        uVar9 = -(ushort)(fVar27 < IVar28.Max.y);
        if ((uVar9 & 1) != 0) {
          iVar21 = -(uint)(IVar28.Min.x < (float)local_68._0_4_ * (local_90.x + 2.0) + fVar26);
          iVar22 = -(uint)(IVar28.Min.y < (float)local_68._0_4_ * (local_90.y + 2.0) + fVar27);
          auVar25._4_4_ = iVar22;
          auVar25._0_4_ = iVar21;
          auVar25._8_4_ = iVar22;
          auVar25._12_4_ = iVar22;
          auVar24._8_8_ = auVar25._8_8_;
          auVar24._4_4_ = iVar21;
          auVar24._0_4_ = iVar21;
          uVar11 = movmskpd((uint)uVar9,auVar24);
          if ((((byte)((byte)uVar11 >> 1) != 0) && (fVar26 < IVar28.Max.x)) && ((uVar11 & 1) != 0))
          {
            pIVar13 = GetForegroundDrawList(&pIVar7->super_ImGuiViewport);
            RenderMouseCursor(pIVar13,(ctx->IO).MousePos,(float)local_68._0_4_,ctx->MouseCursor,
                              0xffffffff,0xff000000,0x30000000);
          }
        }
      }
      if (pIVar7->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar13 = GetForegroundDrawList(&pIVar7->super_ImGuiViewport);
        AddDrawListToDrawData((pIVar7->DrawDataBuilder).Layers,pIVar13);
      }
      IVar6 = (pIVar7->super_ImGuiViewport).Flags;
      iVar21 = (pIVar7->DrawDataBuilder).Layers[0].Size;
      (pIVar7->super_ImGuiViewport).DrawData = &pIVar7->DrawDataP;
      (pIVar7->DrawDataP).Valid = true;
      if (iVar21 < 1) {
        ppIVar17 = (ImDrawList **)0x0;
      }
      else {
        ppIVar17 = (pIVar7->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar7->DrawDataP).TotalIdxCount = 0;
      (pIVar7->DrawDataP).TotalVtxCount = 0;
      (pIVar7->DrawDataP).CmdLists = ppIVar17;
      (pIVar7->DrawDataP).CmdListsCount = iVar21;
      (pIVar7->DrawDataP).DisplayPos = (pIVar7->super_ImGuiViewport).Pos;
      IVar23.x = 0.0;
      IVar23.y = 0.0;
      if (-1 < (char)IVar6) {
        IVar23 = (pIVar7->super_ImGuiViewport).Size;
      }
      (pIVar7->DrawDataP).DisplaySize = IVar23;
      pIVar15 = GetIO();
      (pIVar7->DrawDataP).FramebufferScale = pIVar15->DisplayFramebufferScale;
      (pIVar7->DrawDataP).OwnerViewport = &pIVar7->super_ImGuiViewport;
      uVar11 = (pIVar7->DrawDataBuilder).Layers[0].Size;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
        pIVar13 = (pIVar7->DrawDataBuilder).Layers[0].Data[uVar16];
        piVar1 = &(pIVar7->DrawDataP).TotalVtxCount;
        *piVar1 = *piVar1 + (pIVar13->VtxBuffer).Size;
        piVar1 = &(pIVar7->DrawDataP).TotalIdxCount;
        *piVar1 = *piVar1 + (pIVar13->IdxBuffer).Size;
      }
      pIVar8 = (pIVar7->super_ImGuiViewport).DrawData;
      uVar2 = pIVar8->TotalIdxCount;
      uVar4 = pIVar8->TotalVtxCount;
      uVar3 = (ctx->IO).MetricsRenderVertices;
      uVar5 = (ctx->IO).MetricsRenderIndices;
      (ctx->IO).MetricsRenderVertices = uVar3 + uVar4;
      (ctx->IO).MetricsRenderIndices = uVar5 + uVar2;
    }
    CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x11e3,"void ImGui::Render()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    ImVec2 mouse_cursor_offset, mouse_cursor_size, mouse_cursor_uv[4];
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
        g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &mouse_cursor_offset, &mouse_cursor_size, &mouse_cursor_uv[0], &mouse_cursor_uv[2]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        // (note we scale cursor by current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor)
        if (mouse_cursor_size.x > 0.0f && mouse_cursor_size.y > 0.0f)
        {
            float scale = g.Style.MouseCursorScale * viewport->DpiScale;
            if (viewport->GetMainRect().Overlaps(ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(mouse_cursor_size.x + 2, mouse_cursor_size.y + 2) * scale)))
                RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, scale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));
        }

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        g.IO.MetricsRenderVertices += viewport->DrawData->TotalVtxCount;
        g.IO.MetricsRenderIndices += viewport->DrawData->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}